

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearizer.c
# Opt level: O1

Pseudo * linearize_function_call_expression
                   (Proc *proc,AstNode *expr,AstNode *callsite_expr,Pseudo *callsite_pseudo)

{
  PseudoList **self;
  uint uVar1;
  ravitype_t rVar2;
  C_MemoryAllocator *pCVar3;
  PtrList *pPVar4;
  AstNodeList *head;
  void *pvVar5;
  _func_void_ptr_void_ptr_size_t_size_t *p_Var6;
  BasicBlock *pBVar7;
  long lVar8;
  undefined8 pseudo;
  int iVar9;
  Instruction *insn;
  Constant *pCVar10;
  Pseudo *pPVar11;
  undefined1 *ptr;
  Pseudo *target;
  Pseudo *pPVar12;
  AstNode *expr_00;
  uint *ptr_00;
  undefined1 *puVar13;
  undefined1 *puVar14;
  ulong uVar15;
  ulong uVar16;
  undefined1 uVar17;
  undefined8 uStack_80;
  undefined1 local_78 [8];
  PtrListIterator argiter__;
  Pseudo *local_58;
  Pseudo *local_40;
  
  puVar14 = local_78;
  uVar1 = expr->line_number;
  pCVar3 = proc->linearizer->compiler_state->allocator;
  uStack_80 = 0x11b97f;
  insn = (Instruction *)(*pCVar3->calloc)(pCVar3->arena,1,0x28);
  *(undefined1 *)insn = 0x4f;
  insn->line_number = uVar1;
  pPVar4 = (PtrList *)(expr->field_2).function_stmt.function_expr;
  if (pPVar4 == (PtrList *)0x0) {
    pPVar12 = (Pseudo *)0x0;
    pPVar11 = callsite_pseudo;
  }
  else {
    local_78._0_2_ = 0x101;
    local_78._2_2_ = 0;
    uStack_80 = 0x11b9b2;
    argiter__.__head = pPVar4;
    pCVar10 = add_constant(proc,(Constant *)local_78);
    pCVar3 = proc->linearizer->compiler_state->allocator;
    uStack_80 = 0x11b9cf;
    pPVar11 = (Pseudo *)(*pCVar3->calloc)(pCVar3->arena,1,0x30);
    uVar1 = *(uint *)pPVar11;
    *(uint *)pPVar11 = uVar1 & 0xfffffff0 | 5;
    (pPVar11->field_3).constant = pCVar10;
    *(uint *)pPVar11 = uVar1 & 0xfff00000 | 5 | (uint)pCVar10->index << 4;
    rVar2 = (callsite_expr->field_2).common_expr.type.type_code;
    if (rVar2 == RAVI_TARRAYINT) {
      uVar17 = 0x58;
    }
    else if (rVar2 == RAVI_TARRAYFLT) {
      uVar17 = 0x5a;
    }
    else {
      uVar17 = 0x52;
      if (rVar2 == RAVI_TTABLE) {
        uVar17 = 0x55;
      }
    }
    if ((rVar2 == RAVI_TARRAYFLT) || (rVar2 == RAVI_TARRAYINT)) {
      uStack_80 = 0x11bf05;
      __assert_fail("container_type != RAVI_TARRAYINT && container_type != RAVI_TARRAYFLT",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/linearizer.c"
                    ,0x5d8,
                    "Pseudo *instruct_indexed_load(Proc *, ravitype_t, Pseudo *, ravitype_t, Pseudo *, ravitype_t, unsigned int)"
                   );
    }
    uVar1 = expr->line_number;
    pCVar3 = proc->linearizer->compiler_state->allocator;
    uStack_80 = 0x11ba56;
    ptr = (undefined1 *)(*pCVar3->calloc)(pCVar3->arena,1,0x28);
    *ptr = uVar17;
    *(uint *)(ptr + 0x20) = uVar1;
    if (((undefined1  [48])*callsite_pseudo & (undefined1  [48])0xf) == (undefined1  [48])0xe) {
      uStack_80 = 0x11ba76;
      local_40 = indexed_load(proc,callsite_pseudo);
      pPVar12 = local_40;
    }
    else {
      local_40 = (Pseudo *)0x0;
      pPVar12 = callsite_pseudo;
    }
    uStack_80 = 0x11ba9e;
    raviX_ptrlist_add((PtrList **)(ptr + 8),pPVar12,proc->linearizer->compiler_state->allocator);
    if (((undefined1  [48])*pPVar11 & (undefined1  [48])0xf) == (undefined1  [48])0xe) {
      uStack_80 = 0x11bab5;
      pPVar11 = indexed_load(proc,pPVar11);
      pPVar12 = pPVar11;
    }
    else {
      pPVar12 = (Pseudo *)0x0;
    }
    uStack_80 = 0x11bad5;
    raviX_ptrlist_add((PtrList **)(ptr + 8),pPVar11,proc->linearizer->compiler_state->allocator);
    if (local_40 != (Pseudo *)0x0) {
      uStack_80 = 0x11bae8;
      free_temp_pseudo(proc,local_40,false);
    }
    if (pPVar12 != (Pseudo *)0x0) {
      uStack_80 = 0x11bafa;
      free_temp_pseudo(proc,pPVar12,false);
    }
    uStack_80 = 0x11bb0c;
    pPVar11 = allocate_temp_pseudo(proc,RAVI_TANY,true);
    puVar13 = local_78;
    if (((undefined1  [48])*pPVar11 & (undefined1  [48])0xf) == (undefined1  [48])0xe)
    goto LAB_0011bec7;
    uStack_80 = 0x11bb36;
    raviX_ptrlist_add((PtrList **)(ptr + 0x10),pPVar11,proc->linearizer->compiler_state->allocator);
    if ((*(BasicBlock **)(ptr + 0x18) != (BasicBlock *)0x0) &&
       (*(BasicBlock **)(ptr + 0x18) != proc->current_bb)) goto LAB_0011bf05;
    uStack_80 = 0x11bb64;
    raviX_ptrlist_add((PtrList **)&proc->current_bb->insns,ptr,
                      proc->linearizer->compiler_state->allocator);
    *(BasicBlock **)(ptr + 0x18) = proc->current_bb;
    pPVar12 = callsite_pseudo;
  }
  if (((undefined1  [48])*pPVar11 & (undefined1  [48])0xf) == (undefined1  [48])0x4) {
    uStack_80 = 0x11bb88;
    check_pseudo_is_top(proc,pPVar11);
    target = pPVar11;
  }
  else {
    uStack_80 = 0x11bb99;
    target = allocate_temp_pseudo(proc,RAVI_TANY,true);
    uStack_80 = 0x11bbb7;
    instruct_move(proc,op_mov,target,pPVar11,expr->line_number);
  }
  if (((undefined1  [48])*target & (undefined1  [48])0xf) == (undefined1  [48])0xe) {
    uStack_80 = 0x11bbd5;
    argiter__._16_8_ = indexed_load(proc,target);
    pPVar11 = (Pseudo *)argiter__._16_8_;
  }
  else {
    argiter__.__nr = 0;
    argiter__._20_4_ = 0;
    pPVar11 = target;
  }
  self = &insn->operands;
  uStack_80 = 0x11bc04;
  raviX_ptrlist_add((PtrList **)self,pPVar11,proc->linearizer->compiler_state->allocator);
  uVar16 = 0;
  if (pPVar12 == (Pseudo *)0x0) {
    local_58 = (Pseudo *)0x0;
  }
  else {
    if (((undefined1  [48])*pPVar12 & (undefined1  [48])0xf) == (undefined1  [48])0xe) {
      uStack_80 = 0x11bc22;
      pPVar12 = indexed_load(proc,pPVar12);
      local_58 = pPVar12;
    }
    else {
      local_58 = (Pseudo *)0x0;
    }
    uStack_80 = 0x11bc53;
    raviX_ptrlist_add((PtrList **)self,pPVar12,proc->linearizer->compiler_state->allocator);
  }
  uStack_80 = 0x11bc61;
  iVar9 = raviX_ptrlist_size((PtrList *)(expr->field_2).for_stmt.for_statement_list);
  lVar8 = -((long)iVar9 * 8 + 0xfU & 0xfffffffffffffff0);
  puVar14 = local_78 + lVar8;
  head = (expr->field_2).for_stmt.for_statement_list;
  *(undefined8 *)(local_78 + lVar8 + -8) = 0x11bc8c;
  raviX_ptrlist_forward_iterator((PtrListIterator *)local_78,(PtrList *)head);
  *(undefined8 *)(local_78 + lVar8 + -8) = 0x11bc94;
  expr_00 = (AstNode *)raviX_ptrlist_iter_next((PtrListIterator *)local_78);
  if (expr_00 != (AstNode *)0x0) {
    uVar16 = 0;
    do {
      *(undefined8 *)(local_78 + lVar8 + -8) = 0x11bcaa;
      pPVar11 = linearize_expression(proc,expr_00);
      if ((iVar9 + -1 != (int)uVar16) && ((*(uint *)pPVar11 & 0xf) == 0xb)) {
        if ((pPVar11->field_3).range_in_use != 0) {
          *(undefined8 *)(local_78 + lVar8 + -8) = 0x11bec7;
          __assert_fail("pseudo->range_in_use == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/linearizer.c"
                        ,0x24a,"Pseudo *convert_range_to_temp(Pseudo *)");
        }
        *(uint *)pPVar11 = *(uint *)pPVar11 & 0xfffffff0 | 4;
      }
      if (((undefined1  [48])*pPVar11 & (undefined1  [48])0xf) == (undefined1  [48])0xe) {
        *(undefined8 *)(local_78 + lVar8 + -8) = 0x11bce2;
        pPVar11 = indexed_load(proc,pPVar11);
        pPVar12 = pPVar11;
      }
      else {
        pPVar12 = (Pseudo *)0x0;
      }
      pCVar3 = proc->linearizer->compiler_state->allocator;
      *(undefined8 *)(local_78 + lVar8 + -8) = 0x11bd00;
      raviX_ptrlist_add((PtrList **)self,pPVar11,pCVar3);
      *(Pseudo **)(puVar14 + uVar16 * 8) = pPVar12;
      uVar16 = uVar16 + 1;
      *(undefined8 *)(local_78 + lVar8 + -8) = 0x11bd10;
      expr_00 = (AstNode *)raviX_ptrlist_iter_next((PtrListIterator *)local_78);
    } while (expr_00 != (AstNode *)0x0);
  }
  pCVar3 = proc->linearizer->compiler_state->allocator;
  pvVar5 = pCVar3->arena;
  p_Var6 = pCVar3->calloc;
  *(undefined8 *)(local_78 + lVar8 + -8) = 0x11bd2f;
  pPVar11 = (Pseudo *)(*p_Var6)(pvVar5,1,0x30);
  uVar1 = *(uint *)pPVar11;
  *(uint *)pPVar11 = uVar1 & 0xfffffff0 | 0xb;
  *(uint *)pPVar11 = uVar1 & 0xfff00000 | 0xb | *(uint *)target & 0xffff0;
  if ((*(uint *)target & 0xf) == 4) {
    *(uint *)target = *(uint *)target | 0x100000;
  }
  puVar13 = puVar14;
  if (((undefined1  [48])*pPVar11 & (undefined1  [48])0xf) != (undefined1  [48])0xe) {
    pCVar3 = proc->linearizer->compiler_state->allocator;
    *(undefined8 *)(local_78 + lVar8 + -8) = 0x11bd91;
    raviX_ptrlist_add((PtrList **)&insn->targets,pPVar11,pCVar3);
    argiter__.__head = (PtrList *)(long)(expr->field_2).function_call_expr.num_results;
    local_78._0_2_ = 8;
    local_78._2_2_ = 0;
    *(undefined8 *)(local_78 + lVar8 + -8) = 0x11bdaf;
    pCVar10 = add_constant(proc,(Constant *)local_78);
    pCVar3 = proc->linearizer->compiler_state->allocator;
    pvVar5 = pCVar3->arena;
    p_Var6 = pCVar3->calloc;
    *(undefined8 *)(local_78 + lVar8 + -8) = 0x11bdcc;
    ptr_00 = (uint *)(*p_Var6)(pvVar5,1,0x30);
    uVar1 = *ptr_00;
    *ptr_00 = uVar1 & 0xfffffff0 | 5;
    *(Constant **)(ptr_00 + 2) = pCVar10;
    *ptr_00 = uVar1 & 0xfff00000 | 5 | (uint)pCVar10->index << 4;
    pCVar3 = proc->linearizer->compiler_state->allocator;
    *(undefined8 *)(local_78 + lVar8 + -8) = 0x11be01;
    raviX_ptrlist_add((PtrList **)&insn->targets,ptr_00,pCVar3);
    if ((insn->block == (BasicBlock *)0x0) || (insn->block == proc->current_bb)) {
      pBVar7 = proc->current_bb;
      pCVar3 = proc->linearizer->compiler_state->allocator;
      *(undefined8 *)(local_78 + lVar8 + -8) = 0x11be36;
      raviX_ptrlist_add((PtrList **)&pBVar7->insns,insn,pCVar3);
      insn->block = proc->current_bb;
      *(undefined8 *)(local_78 + lVar8 + -8) = 0x11be49;
      free_instruction_operand_pseudos(proc,insn);
      pseudo = argiter__._16_8_;
      if (argiter__._16_8_ != 0) {
        *(undefined8 *)(local_78 + lVar8 + -8) = 0x11be5c;
        free_temp_pseudo(proc,(Pseudo *)pseudo,false);
      }
      if (local_58 != (Pseudo *)0x0) {
        *(undefined8 *)(local_78 + lVar8 + -8) = 0x11be6f;
        free_temp_pseudo(proc,local_58,false);
      }
      if ((int)uVar16 != 0) {
        uVar15 = 0;
        do {
          pPVar12 = *(Pseudo **)(puVar14 + uVar15 * 8);
          if (pPVar12 != (Pseudo *)0x0) {
            *(undefined8 *)(local_78 + lVar8 + -8) = 0x11be8d;
            free_temp_pseudo(proc,pPVar12,false);
          }
          uVar15 = uVar15 + 1;
        } while ((uVar16 & 0xffffffff) != uVar15);
      }
      return pPVar11;
    }
LAB_0011bf05:
    *(code **)(puVar14 + -8) = linearize_assignment;
    __assert_fail("insn->block == NULL || insn->block == proc->current_bb",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/linearizer.c"
                  ,0x1b1,"void add_instruction(Proc *, Instruction *)");
  }
LAB_0011bec7:
  *(undefined8 *)(puVar13 + -8) = 0x11bee6;
  __assert_fail("pseudo->type != PSEUDO_INDEXED",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/linearizer.c"
                ,0x193,"void add_instruction_target(Proc *, Instruction *, Pseudo *)");
}

Assistant:

static Pseudo *linearize_function_call_expression(Proc *proc, AstNode *expr,
							 AstNode *callsite_expr, Pseudo *callsite_pseudo)
{
	Instruction *insn = allocate_instruction(proc, op_call, expr->line_number);

	Pseudo *self_arg = NULL; /* For method call */
	if (expr->function_call_expr.method_name) {
		const Constant *name_constant =
		    allocate_string_constant(proc, expr->function_call_expr.method_name);
		Pseudo *name_pseudo = allocate_constant_pseudo(proc, name_constant);
		self_arg = callsite_pseudo; /* The original callsite must be passed as 'self' */
		/* create new call site as callsite[name] */
		callsite_pseudo = instruct_indexed_load(proc, callsite_expr->common_expr.type.type_code,
							callsite_pseudo, RAVI_TSTRING, name_pseudo, RAVI_TANY, expr->line_number);
	}

	// callsite needs to be at the top of the stack and also must be a temp
	if (callsite_pseudo->type != PSEUDO_TEMP_ANY) {
		Pseudo *temp = allocate_temp_pseudo(proc, RAVI_TANY, true);
		instruct_move(proc, op_mov, temp, callsite_pseudo, expr->line_number);
		callsite_pseudo = temp;
	}
	else {
		// assert that the pseudo is at the top
		check_pseudo_is_top(proc, callsite_pseudo);
	}

	Pseudo *tofree1 = add_instruction_operand(proc, insn, callsite_pseudo);
	Pseudo *tofree2 = NULL;
	if (self_arg) {
		tofree2 = add_instruction_operand(proc, insn, self_arg);
	}

	// add the args
	AstNode *arg;
	int argc = raviX_ptrlist_size((const PtrList *)expr->function_call_expr.arg_list);
	Pseudo **tofreelist = (Pseudo **) alloca(argc * sizeof(Pseudo *));
	int argi = 0;
	FOR_EACH_PTR(expr->function_call_expr.arg_list, AstNode, arg)
	{
		argc -= 1;
		Pseudo *arg_pseudo = linearize_expression(proc, arg);
		if (argc != 0 && arg_pseudo->type == PSEUDO_RANGE) {
			// Not last one, so range can only be 1
			convert_range_to_temp(arg_pseudo);
		}
		tofreelist[argi++] = add_instruction_operand(proc, insn, arg_pseudo);
	}
	END_FOR_EACH_PTR(arg)

	Pseudo *return_pseudo = allocate_range_pseudo(
	    proc, callsite_pseudo); /* Base reg for function call - where return values will be placed */
	add_instruction_target(proc, insn, return_pseudo);
	add_instruction_target(proc, insn, allocate_constant_pseudo(proc, allocate_integer_constant(proc, expr->function_call_expr.num_results)));
	add_instruction(proc, insn);

	free_instruction_operand_pseudos(proc, insn);
	if (tofree1)
		free_temp_pseudo(proc, tofree1, false);
	if (tofree2)
		free_temp_pseudo(proc, tofree2, false);
	for (int i = 0; i < argi; i++) {
		Pseudo *tofree = tofreelist[i];
		if (tofree)
			free_temp_pseudo(proc, tofree, false);
	}
	return return_pseudo;
}